

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

bool __thiscall
google::protobuf::EnumValueDescriptorProto::IsInitialized(EnumValueDescriptorProto *this)

{
  bool bVar1;
  
  bVar1 = _internal_has_options(this);
  if ((bVar1) && (bVar1 = EnumValueOptions::IsInitialized(this->options_), !bVar1)) {
    return false;
  }
  return true;
}

Assistant:

bool EnumValueDescriptorProto::IsInitialized() const {
  if (_internal_has_options()) {
    if (!options_->IsInitialized()) return false;
  }
  return true;
}